

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dreadhb.c
# Opt level: O0

int dReadValues(FILE *fp,int n,double *destination,int perline,int persize)

{
  char cVar1;
  int iVar2;
  double dVar3;
  char local_a8 [8];
  char buf [100];
  int iStack_34;
  char tmp;
  int s;
  int k;
  int j;
  int i;
  int persize_local;
  int perline_local;
  double *destination_local;
  int n_local;
  FILE *fp_local;
  
  k = 0;
  while (k < n) {
    fgets(local_a8,100,(FILE *)fp);
    for (s = 0; s < perline && k < n; s = s + 1) {
      cVar1 = local_a8[(s + 1) * persize];
      local_a8[(s + 1) * persize] = '\0';
      iVar2 = s * persize;
      for (iStack_34 = 0; iStack_34 < persize; iStack_34 = iStack_34 + 1) {
        if ((local_a8[iVar2 + iStack_34] == 'D') || (local_a8[iVar2 + iStack_34] == 'd')) {
          local_a8[iVar2 + iStack_34] = 'E';
        }
      }
      dVar3 = atof(local_a8 + iVar2);
      destination[k] = dVar3;
      local_a8[(s + 1) * persize] = cVar1;
      k = k + 1;
    }
  }
  return 0;
}

Assistant:

int dReadValues(FILE *fp, int n, double *destination, int perline, int persize)
{
    register int i, j, k, s;
    char tmp, buf[100];
    
    i = 0;
    while (i < n) {
	fgets(buf, 100, fp);    /* read a line at a time */
	for (j=0; j<perline && i<n; j++) {
	    tmp = buf[(j+1)*persize];     /* save the char at that place */
	    buf[(j+1)*persize] = 0;       /* null terminate */
	    s = j*persize;
	    for (k = 0; k < persize; ++k) /* No D_ format in C */
		if ( buf[s+k] == 'D' || buf[s+k] == 'd' ) buf[s+k] = 'E';
	    destination[i++] = atof(&buf[s]);
	    buf[(j+1)*persize] = tmp;     /* recover the char at that place */
	}
    }

    return 0;
}